

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

int Frc_ManPlaceDfsBoth(Frc_Man_t *p,Vec_Int_t *vCoOrder,int *piCutSize2)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar3 = Frc_ManCrossCut(p,vCoOrder,0);
  iVar4 = vCoOrder->nSize;
  if (1 < iVar4) {
    piVar2 = vCoOrder->pArray;
    iVar5 = -1;
    lVar7 = 0;
    do {
      iVar6 = piVar2[lVar7];
      piVar2[lVar7] = piVar2[iVar4 + iVar5];
      piVar2[vCoOrder->nSize + iVar5] = iVar6;
      lVar7 = lVar7 + 1;
      iVar4 = vCoOrder->nSize;
      iVar5 = iVar5 + -1;
    } while (lVar7 < iVar4 / 2);
  }
  iVar4 = Frc_ManCrossCut(p,vCoOrder,0);
  if (iVar4 < iVar3) {
    Frc_ManPlaceDfs(p,vCoOrder);
    iVar6 = vCoOrder->nSize;
    iVar5 = iVar4;
    if (1 < iVar6) {
      piVar2 = vCoOrder->pArray;
      iVar4 = -1;
      lVar7 = 0;
      do {
        iVar1 = piVar2[lVar7];
        piVar2[lVar7] = piVar2[iVar6 + iVar4];
        piVar2[vCoOrder->nSize + iVar4] = iVar1;
        lVar7 = lVar7 + 1;
        iVar6 = vCoOrder->nSize;
        iVar4 = iVar4 + -1;
      } while (lVar7 < iVar6 / 2);
    }
  }
  else {
    iVar5 = vCoOrder->nSize;
    if (1 < iVar5) {
      piVar2 = vCoOrder->pArray;
      iVar6 = -1;
      lVar7 = 0;
      do {
        iVar1 = piVar2[lVar7];
        piVar2[lVar7] = piVar2[iVar5 + iVar6];
        piVar2[vCoOrder->nSize + iVar6] = iVar1;
        lVar7 = lVar7 + 1;
        iVar5 = vCoOrder->nSize;
        iVar6 = iVar6 + -1;
      } while (lVar7 < iVar5 / 2);
    }
    Frc_ManPlaceDfs(p,vCoOrder);
    iVar5 = iVar3;
    iVar3 = iVar4;
  }
  *piCutSize2 = iVar3;
  return iVar5;
}

Assistant:

int Frc_ManPlaceDfsBoth( Frc_Man_t * p, Vec_Int_t * vCoOrder, int * piCutSize2 )
{
    int nCutStart1, nCutStart2;
    nCutStart1 = Frc_ManCrossCut( p, vCoOrder, 0 );
    Vec_IntReverseOrder( vCoOrder );
    nCutStart2 = Frc_ManCrossCut( p, vCoOrder, 0 );
    if ( nCutStart1 <= nCutStart2 )
    {
        Vec_IntReverseOrder( vCoOrder ); // undo
        Frc_ManPlaceDfs( p, vCoOrder );
        *piCutSize2 = nCutStart2;
        return nCutStart1;
    }
    else
    {
        Frc_ManPlaceDfs( p, vCoOrder );
        Vec_IntReverseOrder( vCoOrder ); // undo
        *piCutSize2 = nCutStart1;
        return nCutStart2;
    }
}